

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O1

void __thiscall position::setup(position *this,istringstream *fen)

{
  uint uVar1;
  Color *c_00;
  U64 *pUVar2;
  U16 *pUVar3;
  char cVar4;
  ushort uVar5;
  Color us;
  int iVar6;
  bool bVar7;
  int iVar8;
  Square SVar9;
  U64 UVar10;
  mapped_type *pmVar11;
  int *piVar12;
  long lVar13;
  undefined8 uVar14;
  Square SVar15;
  int iVar16;
  char *c_1;
  Square *s_00;
  Color us_00;
  size_type sVar17;
  char *c;
  _Alloc_hider _Var18;
  Square s;
  Color stm;
  string token;
  Square local_6c;
  undefined8 local_68;
  istringstream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Color local_34;
  
  clear(this);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_60 = fen;
  std::operator>>((istream *)fen,(string *)&local_58);
  local_6c = A8;
  if (local_58._M_string_length != 0) {
    sVar17 = local_58._M_string_length;
    _Var18._M_p = local_58._M_dataplus._M_p;
    do {
      uVar1 = (int)*_Var18._M_p - 0x30;
      if (uVar1 < 10) {
        local_6c = local_6c + uVar1;
      }
      else if (*_Var18._M_p == '/') {
        local_6c = local_6c - A3;
      }
      else {
        set_piece(this,_Var18._M_p,&local_6c);
        local_6c = local_6c + B1;
      }
      _Var18._M_p = _Var18._M_p + 1;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"w");
  c_00 = &(this->ifo).stm;
  (this->ifo).stm = (uint)(iVar8 != 0);
  UVar10 = zobrist::stm(c_00);
  pUVar2 = &(this->ifo).key;
  *pUVar2 = *pUVar2 ^ UVar10;
  UVar10 = zobrist::stm(c_00);
  pUVar2 = &(this->ifo).repkey;
  *pUVar2 = *pUVar2 ^ UVar10;
  std::operator>>((istream *)local_60,(string *)&local_58);
  (this->ifo).cmask = 0;
  if (local_58._M_string_length != 0) {
    _Var18._M_p = local_58._M_dataplus._M_p;
    sVar17 = local_58._M_string_length;
    do {
      pmVar11 = std::
                map<char,_unsigned_short,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_short>_>_>
                ::at(&CastleRights,_Var18._M_p);
      uVar5 = *pmVar11;
      local_68._0_1_ = (undefined1)uVar5;
      local_68._1_1_ = (undefined1)(uVar5 >> 8);
      pUVar3 = &(this->ifo).cmask;
      *pUVar3 = *pUVar3 | uVar5;
      UVar10 = zobrist::castle(c_00,(U16 *)&local_68);
      pUVar2 = &(this->ifo).key;
      *pUVar2 = *pUVar2 ^ UVar10;
      UVar10 = zobrist::castle(c_00,(U16 *)&local_68);
      pUVar2 = &(this->ifo).repkey;
      *pUVar2 = *pUVar2 ^ UVar10;
      _Var18._M_p = _Var18._M_p + 1;
      sVar17 = sVar17 - 1;
    } while (sVar17 != 0);
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  (this->ifo).eps = no_square;
  if (local_58._M_string_length == 0) {
    SVar15 = squares|B3;
  }
  else {
    iVar16 = 9;
    sVar17 = 0;
    iVar8 = 9;
    do {
      cVar4 = local_58._M_dataplus._M_p[sVar17];
      iVar6 = cVar4 + -0x61;
      if (7 < (byte)(cVar4 + 0x9fU)) {
        iVar6 = iVar16;
      }
      iVar16 = iVar6;
      if ((cVar4 == '6') || (cVar4 == '3')) {
        iVar8 = cVar4 + -0x31;
      }
      sVar17 = sVar17 + 1;
    } while (local_58._M_string_length != sVar17);
    SVar15 = iVar16 + iVar8 * 8;
  }
  SVar9 = no_square;
  if (SVar15 < squares) {
    SVar9 = SVar15;
  }
  (this->ifo).eps = SVar9;
  if (SVar15 < squares) {
    local_68._0_1_ = (char)SVar9 & 7;
    UVar10 = zobrist::ep((U8 *)&local_68);
    pUVar2 = &(this->ifo).key;
    *pUVar2 = *pUVar2 ^ UVar10;
    local_68._0_1_ = (char)(this->ifo).eps & 7;
    UVar10 = zobrist::ep((U8 *)&local_68);
    pUVar2 = &(this->ifo).repkey;
    *pUVar2 = *pUVar2 ^ UVar10;
  }
  std::operator>>((istream *)local_60,(string *)&local_58);
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"-");
  _Var18._M_p = local_58._M_dataplus._M_p;
  if (iVar8 == 0) {
    lVar13 = 0;
LAB_0011f651:
    local_68._0_1_ = (undefined1)lVar13;
    (this->ifo).move50 = (undefined1)local_68;
    local_68._1_1_ = white >> 8;
    UVar10 = zobrist::mv50((U16 *)&local_68);
    pUVar2 = &(this->ifo).key;
    *pUVar2 = *pUVar2 ^ UVar10;
    std::operator>>((istream *)local_60,(string *)&local_58);
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"-");
    _Var18._M_p = local_58._M_dataplus._M_p;
    if (iVar8 == 0) {
      lVar13 = 0;
LAB_0011f6ee:
      (this->ifo).hmvs = (U16)lVar13;
      UVar10 = zobrist::hmvs(&(this->ifo).hmvs);
      pUVar2 = &(this->ifo).key;
      *pUVar2 = *pUVar2 ^ UVar10;
      us = (this->ifo).stm;
      local_68._0_1_ = (undefined1)us;
      local_68._1_1_ = (undefined1)(us >> 8);
      local_68._2_2_ = (undefined2)(us >> 0x10);
      s_00 = (this->ifo).ks + us;
      *s_00 = (this->pcs).king_sq._M_elems[us];
      us_00 = (Color)((long)(int)us ^ 1U);
      local_34 = us_00;
      bVar7 = is_attacked(this,s_00,(Color *)&local_68,&local_34,0);
      (this->ifo).incheck = bVar7;
      if (bVar7) {
        local_34 = us_00;
        UVar10 = attackers_of2(this,s_00,&local_34);
      }
      else {
        UVar10 = 0;
      }
      (this->ifo).checkers = UVar10;
      UVar10 = pinned(this,us);
      (this->ifo).pinned[us] = UVar10;
      UVar10 = pinned(this,us_00);
      (this->ifo).pinned[(long)(int)us ^ 1U] = UVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    piVar12 = __errno_location();
    iVar8 = *piVar12;
    *piVar12 = 0;
    lVar13 = strtol(_Var18._M_p,(char **)&local_68,10);
    if ((pointer)CONCAT44(local_68._4_4_,
                          CONCAT22(local_68._2_2_,CONCAT11(local_68._1_1_,(undefined1)local_68))) !=
        _Var18._M_p) {
      if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
        if (*piVar12 == 0) {
          *piVar12 = iVar8;
        }
        goto LAB_0011f6ee;
      }
      goto LAB_0011f7e5;
    }
  }
  else {
    piVar12 = __errno_location();
    iVar8 = *piVar12;
    *piVar12 = 0;
    lVar13 = strtol(_Var18._M_p,(char **)&local_68,10);
    if ((pointer)CONCAT44(local_68._4_4_,
                          CONCAT22(local_68._2_2_,CONCAT11(local_68._1_1_,(undefined1)local_68))) ==
        _Var18._M_p) {
      std::__throw_invalid_argument("stoi");
    }
    else if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
      if (*piVar12 == 0) {
        *piVar12 = iVar8;
      }
      goto LAB_0011f651;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0011f7e5:
  uVar14 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(uVar14);
}

Assistant:

void position::setup(std::istringstream& fen) {
	clear();

	std::string token;
	fen >> token;
	Square s = Square::A8;

	for (auto& c : token) {
		if (isdigit(c)) s += int(c - '0');
		else if (c == '/') s -= 16;
		else { set_piece(c, s); ++s; }
	}

	// side to move
	fen >> token;
	ifo.stm = (token == "w" ? Color::white : Color::black);
	ifo.key ^= zobrist::stm(ifo.stm);
	ifo.repkey ^= zobrist::stm(ifo.stm);

	// the castle rights
	fen >> token;
	ifo.cmask = U16(0);
	for (auto& c : token) {
		U16 cr = CastleRights.at(c);
		ifo.cmask |= cr;
		ifo.key ^= zobrist::castle(ifo.stm, cr);
		ifo.repkey ^= zobrist::castle(ifo.stm, cr);
	}


	// ep square
	fen >> token;
	ifo.eps = Square::no_square;
	Row row = Row::no_row; Col col = Col::no_col;
	for (auto& c : token) {
		if (c >= 'a' && c <= 'h') col = Col(c - 'a');
		if (c == '3' || c == '6') row = Row(c - '1');
	}
	ifo.eps = Square(8 * row + col);

	if (!util::on_board(ifo.eps)) ifo.eps = Square::no_square;

	if (ifo.eps != Square::no_square) {
		ifo.key ^= zobrist::ep(util::col(ifo.eps));
		ifo.repkey ^= zobrist::ep(util::col(ifo.eps));
	}

	// half-moves since last pawn move/capture
	fen >> token;

	ifo.move50 = (token != "-" ? U8(std::stoi(token)) : 0);

	ifo.key ^= zobrist::mv50(ifo.move50);

	// move counter
	fen >> token;
	ifo.hmvs = (token != "-" ? U16(std::stoi(token)) : 0);
	ifo.key ^= zobrist::hmvs(ifo.hmvs);

	// check info
	Color stm = to_move();
	ifo.ks[stm] = pcs.king_sq[stm];
	ifo.incheck = is_attacked(ifo.ks[stm], stm, Color(stm ^ 1));

	ifo.checkers = (in_check() ? attackers_of2(ifo.ks[stm], Color(stm ^ 1)) : 0ULL);
	ifo.pinned[stm] = pinned(stm);
	ifo.pinned[stm ^ 1] = pinned(Color(stm ^ 1));
}